

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

vector sptk::swipe::spline(vector x,vector y)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double *pdVar4;
  double *__ptr;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  double *pdVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  vector vVar22;
  
  pdVar9 = x.v;
  pdVar5 = y.v;
  iVar10 = x.x;
  lVar11 = (long)iVar10;
  pdVar4 = (double *)malloc(lVar11 * 8);
  uVar8 = iVar10 - 1;
  __ptr = (double *)malloc((ulong)uVar8 * 8);
  *pdVar4 = -0.5;
  dVar17 = pdVar9[1];
  dVar14 = dVar17 - *pdVar9;
  dVar15 = pdVar5[1];
  dVar14 = ((dVar15 - *pdVar5) / dVar14 + -2.0) * (3.0 / dVar14);
  *__ptr = dVar14;
  if (2 < iVar10) {
    dVar13 = -0.5;
    lVar7 = 0;
    do {
      dVar1 = pdVar9[lVar7 + 2];
      dVar16 = dVar17 - pdVar9[lVar7];
      dVar18 = dVar1 - pdVar9[lVar7];
      dVar2 = pdVar5[lVar7 + 2];
      auVar19._0_8_ = dVar2 - dVar15;
      auVar19._8_8_ = dVar15 - pdVar5[lVar7];
      auVar20._8_8_ = dVar16;
      auVar20._0_8_ = dVar1 - dVar17;
      auVar20 = divpd(auVar19,auVar20);
      dVar16 = dVar16 / dVar18;
      dVar17 = dVar13 * dVar16 + 2.0;
      auVar21._0_8_ = ((auVar20._0_8_ - auVar20._8_8_) * 6.0) / dVar18 - dVar16 * dVar14;
      auVar21._8_8_ = dVar16 + -1.0;
      auVar3._8_8_ = dVar17;
      auVar3._0_8_ = dVar17;
      auVar20 = divpd(auVar21,auVar3);
      dVar13 = auVar20._8_8_;
      pdVar4[lVar7 + 1] = dVar13;
      dVar14 = auVar20._0_8_;
      __ptr[lVar7 + 1] = dVar14;
      lVar7 = lVar7 + 1;
      dVar15 = dVar2;
      dVar17 = dVar1;
    } while ((ulong)uVar8 - 1 != lVar7);
  }
  pdVar4[lVar11 + -1] =
       (__ptr[lVar11 + -2] * -0.5 +
       (2.0 - (pdVar5[(long)y.x + -1] - pdVar5[(long)y.x + -2]) /
              (pdVar9[(int)uVar8] - pdVar9[lVar11 + -2])) *
       (3.0 / (pdVar9[(int)uVar8] - pdVar9[lVar11 + -2]))) / (pdVar4[lVar11 + -2] * 0.5 + 1.0);
  if (1 < iVar10) {
    uVar6 = (ulong)(iVar10 - 2);
    dVar17 = pdVar4[uVar6 + 1];
    do {
      dVar17 = dVar17 * pdVar4[uVar6] + __ptr[uVar6];
      pdVar4[uVar6] = dVar17;
      bVar12 = uVar6 != 0;
      uVar6 = uVar6 - 1;
    } while (bVar12);
  }
  free(__ptr);
  vVar22._0_8_ = x._0_8_ & 0xffffffff;
  vVar22.v = pdVar4;
  return vVar22;
}

Assistant:

vector spline(vector x, vector y) {
    int i, j;
    double p, qn, sig;
    vector y2 = makev(x.x);
#if 0
    double* u = malloc((unsigned) (x.x - 1) * sizeof(double));
#else
    double* u = (double*) malloc((unsigned) (x.x - 1) * sizeof(double));
#endif
    y2.v[0] = -.5; // left boundary
    u[0] = (3. / (x.v[1] - x.v[0])) * ((y.v[1] - y.v[0]) /
                                       (x.v[1] - x.v[0]) - YP1);
    for (i = 1; i < x.x - 1; i++) { // decomp loop
        sig = (x.v[i] - x.v[i - 1]) / (x.v[i + 1] - x.v[i - 1]);
        p = sig * y2.v[i - 1] + 2.;
        y2.v[i] = (sig - 1.) / p;
        u[i] = (y.v[i + 1] - y.v[i]) / (x.v[i + 1] - x.v[i]) -
               (y.v[i] - y.v[i - 1]) / (x.v[i] - x.v[i - 1]);
        u[i] = (6 * u[i] / (x.v[i + 1] - x.v[i - 1]) - sig * u[i - 1]) / p;
    }
    qn = .5; // right boundary
    y2.v[y2.x - 1] = ((3. / (x.v[x.x - 1] - x.v[x.x - 2])) * (YPN -
                      (y.v[y.x - 1] - y.v[y.x -  2]) / (x.v[x.x - 1] -
                       x.v[x.x - 2])) - qn * u[x.x - 2]) /
                       (qn * y2.v[y2.x - 2] + 1.);
    for (j = x.x - 2; j >= 0; j--) // backsubstitution loop
        y2.v[j] = y2.v[j] * y2.v[j + 1] + u[j];
    free(u);
    return(y2);
}